

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::torrent_update_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,torrent_update_alert *this)

{
  difference_type in_RCX;
  span<const_char> in;
  span<const_char> in_00;
  string local_138;
  string local_118;
  char msg [200];
  
  in.m_len = in_RCX;
  in.m_ptr = (char *)0x14;
  aux::to_hex_abi_cxx11_(&local_138,(aux *)&this->old_ih,in);
  in_00.m_len = in_RCX;
  in_00.m_ptr = (char *)0x14;
  aux::to_hex_abi_cxx11_(&local_118,(aux *)&this->new_ih,in_00);
  snprintf(msg,200," torrent changed info-hash from: %s to %s",local_138._M_dataplus._M_p,
           local_118._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  torrent_alert::message_abi_cxx11_(&local_138,&this->super_torrent_alert);
  std::operator+(__return_storage_ptr__,&local_138,msg);
  std::__cxx11::string::~string((string *)&local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string torrent_update_alert::message() const
	{
		char msg[200];
		std::snprintf(msg, sizeof(msg), " torrent changed info-hash from: %s to %s"
			, aux::to_hex(old_ih).c_str()
			, aux::to_hex(new_ih).c_str());
		return torrent_alert::message() + msg;
	}